

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClass.c
# Opt level: O0

void Fra_ClassesStop(Fra_Cla_t *p)

{
  Fra_Cla_t *p_local;
  
  if (p->pMemClasses != (Aig_Obj_t **)0x0) {
    free(p->pMemClasses);
    p->pMemClasses = (Aig_Obj_t **)0x0;
  }
  if (p->pMemRepr != (Aig_Obj_t **)0x0) {
    free(p->pMemRepr);
    p->pMemRepr = (Aig_Obj_t **)0x0;
  }
  if (p->vClassesTemp != (Vec_Ptr_t *)0x0) {
    Vec_PtrFree(p->vClassesTemp);
  }
  if (p->vClassNew != (Vec_Ptr_t *)0x0) {
    Vec_PtrFree(p->vClassNew);
  }
  if (p->vClassOld != (Vec_Ptr_t *)0x0) {
    Vec_PtrFree(p->vClassOld);
  }
  if (p->vClasses1 != (Vec_Ptr_t *)0x0) {
    Vec_PtrFree(p->vClasses1);
  }
  if (p->vClasses != (Vec_Ptr_t *)0x0) {
    Vec_PtrFree(p->vClasses);
  }
  if (p->vImps != (Vec_Int_t *)0x0) {
    Vec_IntFree(p->vImps);
  }
  if (p != (Fra_Cla_t *)0x0) {
    free(p);
  }
  return;
}

Assistant:

void Fra_ClassesStop( Fra_Cla_t * p )
{
    ABC_FREE( p->pMemClasses );
    ABC_FREE( p->pMemRepr );
    if ( p->vClassesTemp ) Vec_PtrFree( p->vClassesTemp );
    if ( p->vClassNew )    Vec_PtrFree( p->vClassNew );
    if ( p->vClassOld )    Vec_PtrFree( p->vClassOld );
    if ( p->vClasses1 )    Vec_PtrFree( p->vClasses1 );
    if ( p->vClasses )     Vec_PtrFree( p->vClasses );
    if ( p->vImps )        Vec_IntFree( p->vImps );
    ABC_FREE( p );
}